

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

double __thiscall
NEST::LArNEST::LegacyGetRecombinationProbability
          (LArNEST *this,double energy,double efield,double density,int pdgcode,double track_length)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_38;
  
  iVar1 = -pdgcode;
  if (0 < pdgcode) {
    iVar1 = pdgcode;
  }
  if ((iVar1 == 0xb) || (iVar1 == 0xd)) {
    dVar3 = track_length / 10.0;
    auVar5._8_8_ = energy / 1000.0;
    auVar5._0_8_ = 0x3ff0000000000000;
    auVar6._8_8_ = dVar3;
    auVar6._0_8_ = density;
    auVar6 = divpd(auVar5,auVar6);
    local_38 = (double)(-(ulong)(dVar3 != 0.0) & (ulong)(auVar6._8_8_ * auVar6._0_8_));
    if ((0.0 < dVar3) &&
       (((0.0 < energy && (0.0 < local_38)) &&
        (dVar3 = LegacyGetLinearEnergyTransfer(this,energy), pdgcode == 0xb)))) {
      uVar2 = -(ulong)(dVar3 / local_38 < 0.7);
      local_38 = (double)(~uVar2 & (ulong)local_38 | (ulong)(local_38 * (dVar3 / local_38)) & uVar2)
      ;
    }
  }
  else {
    local_38 = LegacyGetLinearEnergyTransfer(this,energy);
  }
  dVar3 = pow(efield / 1000.0,-0.85);
  dVar3 = dVar3 * 0.07;
  if ((efield == 0.0) && (!NAN(efield))) {
    dVar3 = 0.0003;
  }
  dVar4 = 0.0;
  if ((efield == 0.0) && (!NAN(efield))) {
    dVar4 = 0.75;
  }
  auVar8._8_8_ = local_38 * dVar3;
  auVar8._0_8_ = density;
  auVar7._8_8_ = (dVar3 / (1.0 - dVar4)) * local_38 + 1.0;
  auVar7._0_8_ = 0x3ff649ba5e353f7d;
  auVar6 = divpd(auVar8,auVar7);
  dVar4 = (auVar6._8_8_ + dVar4) * auVar6._0_8_;
  dVar3 = 0.0;
  if (0.0 <= dVar4) {
    dVar3 = dVar4;
  }
  dVar4 = 1.0;
  if (dVar3 <= 1.0) {
    dVar4 = dVar3;
  }
  return dVar4;
}

Assistant:

double LArNEST::LegacyGetRecombinationProbability(double energy, double efield,
                                                  double density, int pdgcode,
                                                  double track_length) {
  // this section calculates recombination following the modified
  // Birks' Law of Doke, deposition by deposition, may be overridden
  // later in code if a low enough energy necessitates switching to the
  // Thomas-Imel box model for recombination instead (determined by site)
  double dE = energy;
  double dx = 0.0;
  double LET = 0.0;
  double recombProb;
  if (abs(pdgcode) != 11 && abs(pdgcode) != 13) {
    // e-: 11, e+: -11, mu-: 13, mu+: -13
    // in other words, if it's a gamma,ion,proton,alpha,pion,et al. do not
    // use the step length provided by Geant4 because it's not relevant,
    // instead calculate an estimated LET and range of the electrons that
    // would have been produced if Geant4 could track them
    LET = LegacyGetLinearEnergyTransfer(dE);
    if (LET) {
      // find the range based on the LET
      dx = (dE / 1e3) / (density * LET);
    }
    if (abs(pdgcode) == 2112)  // nuclear recoils
    {
      dx = 0;
    }
  } else  // normal case of an e-/+ energy deposition recorded by Geant
  {
    dx = track_length / 10.;
    if (dx) {
      LET = ((dE / 1e3) / dx) *
            (1 / density);  // lin. energy xfer (prop. to dE/dx)
    }
    if (LET > 0 && dE > 0 && dx > 0) {
      double ratio = LegacyGetLinearEnergyTransfer(dE) / LET;
      if (ratio < 0.7 && pdgcode == 11) {
        dx /= ratio;
        LET *= ratio;
      }
    }
  }
  // set up DokeBirks coefficients
  double DokeBirksA = 0.07 * pow((efield / 1.0e3), -0.85);
  double DokeBirksC = 0.00;
  if (efield == 0.0) {
    DokeBirksA = 0.0003;
    DokeBirksC = 0.75;
  }
  // B=A/(1-C) (see paper)
  double DokeBirksB = DokeBirksA / (1 - DokeBirksC);
  recombProb = ((DokeBirksA * LET) / (1 + DokeBirksB * LET) + DokeBirksC) *
               (density / legacy_density_LAr);

  // check against unphysicality resulting from rounding errors
  if (recombProb < 0.0) {
    recombProb = 0.0;
  }
  if (recombProb > 1.0) {
    recombProb = 1.0;
  }
  return recombProb;
}